

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O2

plt_lib plt_get_lib(plt_ctx ctx,char *name)

{
  long lVar1;
  plt_selector pVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  plt_lib in_RCX;
  plt_lib plVar7;
  undefined1 **ppuVar8;
  plt_lib plVar9;
  link_map **pplVar10;
  bool bVar11;
  undefined1 *local_58;
  plt_ctx local_50;
  size_t local_48;
  ulong local_40;
  plt_lib local_38;
  char *val;
  
  ppuVar8 = &local_58;
  if (name == (char *)0x0) {
    plVar9 = ctx->r_map;
  }
  else {
    local_38 = (plt_lib)0x0;
    pVar2 = plt_get_selector(name,(char **)&local_38);
    plVar9 = local_38;
    sVar4 = strlen((char *)local_38);
    if ((char)plVar9->l_addr == 'c') {
      bVar11 = *(char *)((long)&plVar9->l_addr + 1) == '\0';
    }
    else {
      bVar11 = false;
    }
    local_48 = sVar4 + 8;
    local_40 = sVar4 + 0x17 & 0xfffffffffffffff0;
    pplVar10 = &ctx->r_map;
    local_50 = ctx;
    while (plVar7 = local_38, plVar9 = *pplVar10, plVar9 != (plt_lib)0x0) {
      if (pVar2 == PLT_SEL_LIB) {
        *(undefined8 *)((long)ppuVar8 + -8) = 0x102ad1;
        pcVar5 = get_lib_name(ctx,plVar9);
        plVar7 = local_38;
        sVar4 = local_48;
        if (bVar11) {
          *(undefined8 *)((long)ppuVar8 + -8) = 0x102ae8;
          pcVar6 = strstr(pcVar5,"/libc.so");
          if (pcVar6 != (char *)0x0) {
            return plVar9;
          }
          *(undefined8 *)((long)ppuVar8 + -8) = 0x102afc;
          pcVar5 = strstr(pcVar5,"/musl.so");
        }
        else {
          lVar1 = -local_40;
          pcVar6 = (char *)((long)ppuVar8 + lVar1);
          local_58 = (undefined1 *)ppuVar8;
          builtin_strncpy((char *)((long)ppuVar8 + lVar1 + -8),"S+\x10",4);
          pcVar6[-4] = '\0';
          pcVar6[-3] = '\0';
          pcVar6[-2] = '\0';
          pcVar6[-1] = '\0';
          snprintf(pcVar6,sVar4,"/lib%s.so");
          builtin_strncpy((char *)((long)ppuVar8 + lVar1 + -8),"a+\x10",4);
          pcVar6[-4] = '\0';
          pcVar6[-3] = '\0';
          pcVar6[-2] = '\0';
          pcVar6[-1] = '\0';
          pcVar5 = strstr(pcVar5,pcVar6);
          in_RCX = plVar7;
          ppuVar8 = (undefined1 **)local_58;
          ctx = local_50;
        }
joined_r0x00102b6c:
        if (pcVar5 != (char *)0x0) {
          return plVar9;
        }
      }
      else if ((pVar2 & ~PLT_SEL_FILE) == PLT_SEL_NONE) {
        *(undefined8 *)((long)ppuVar8 + -8) = 0x102b7e;
        pcVar5 = get_lib_name(ctx,plVar9);
        plVar7 = local_38;
        *(undefined8 *)((long)ppuVar8 + -8) = 0x102b8a;
        iVar3 = strcmp((char *)plVar7,pcVar5);
        if (iVar3 == 0) {
          return plVar9;
        }
      }
      else if (pVar2 == PLT_SEL_SYM) {
        *(undefined8 *)((long)ppuVar8 + -8) = 0x102b1f;
        pcVar5 = (char *)get_offsets((plt_ctx)plVar9,plVar7,(char *)0x0,(plt_offset **)in_RCX);
        goto joined_r0x00102b6c;
      }
      pplVar10 = &plVar9->l_next;
    }
  }
  return plVar9;
}

Assistant:

plt_lib plt_get_lib(plt_ctx ctx, const char *name)
{
    if (!name)
        return ctx->r_map;

    const char *val = NULL;
    enum plt_selector sel = plt_get_selector(name, &val);
    size_t val_len = strlen(val);
    int libc = !strcmp(val, "c");

    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        if (sel == PLT_SEL_LIB) {
            const char *libname = get_lib_name(ctx, lm);
            if (libc) {
                if (strstr(libname, "/libc.so")
                 || strstr(libname, "/musl.so"))
                    return lm;
            } else {
                size_t len = val_len + 8;
                char pattern[len];
                snprintf(pattern, len, "/lib%s.so", val);
                if (strstr(libname, pattern))
                    return lm;
            }
        } else if (sel == PLT_SEL_NONE || sel == PLT_SEL_FILE) {
            const char *libname = get_lib_name(ctx, lm);
            if (!strcmp(val, libname))
                return lm;
        } else if (sel == PLT_SEL_SYM) {
            if (get_offsets(ctx, lm, val, NULL) > 0)
                return lm;
        }
    }
    return NULL;
}